

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prof.c
# Opt level: O1

void build_fire(CHAR_DATA *ch,int dur)

{
  PC_DATA *pPVar1;
  ushort uVar2;
  short sVar3;
  int iVar4;
  char *pcVar5;
  OBJ_INDEX_DATA *pObjIndex;
  OBJ_DATA *obj;
  int iVar6;
  CProficiencies *pCVar7;
  basic_string_view<char> fmt;
  basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> args;
  string buffer;
  long *local_2a8 [2];
  long local_298 [2];
  char *local_288 [2];
  char *local_278;
  buffer<char> local_260;
  char local_240 [536];
  
  iVar4 = number_percent();
  pPVar1 = ch->pcdata;
  uVar2 = CProficiencies::ProfIndexLookup("firestarting");
  iVar6 = 0x39;
  if (uVar2 < 0x19) {
    if (pPVar1 == (PC_DATA *)0x0) {
      pCVar7 = &prof_none;
    }
    else {
      pCVar7 = &pPVar1->profs;
    }
    iVar6 = pCVar7->profs[uVar2] * 3 + 0x3c;
  }
  if (iVar6 < iVar4) {
    act("$n\'s fire dies out despite $s best attempts to kindle it.",ch,(void *)0x0,(void *)0x0,0);
    act("Your fire dies out despite your best attempts to kindle it.",ch,(void *)0x0,(void *)0x0,3);
    if (ch->pcdata == (PC_DATA *)0x0) {
      pCVar7 = &prof_none;
    }
    else {
      pCVar7 = &ch->pcdata->profs;
    }
    sVar3 = CProficiencies::ProfIndexLookup("firestarting");
    CProficiencies::CheckImprove(pCVar7,(int)sVar3,300);
    return;
  }
  pcVar5 = get_char_color(ch,"lightred");
  local_278 = END_COLOR(ch);
  local_260.size_ = 0;
  local_260._vptr_buffer = (_func_int **)&PTR_grow_00457340;
  local_260.capacity_ = 500;
  fmt.size_ = 0x5b;
  fmt.data_ = 
  "{}The spark is caught by some dried brush, and it quickly erupts into a blazing campfire!{}";
  args.field_1.values_ = (value<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> *)local_288
  ;
  args.desc_ = 0xcc;
  local_288[0] = pcVar5;
  local_260.ptr_ = local_240;
  ::fmt::v9::detail::vformat_to<char>(&local_260,fmt,args,(locale_ref)0x0);
  local_2a8[0] = local_298;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2a8,local_260.ptr_,local_260.ptr_ + local_260.size_);
  if (local_260.ptr_ != local_240) {
    operator_delete(local_260.ptr_,local_260.capacity_);
  }
  act((char *)local_2a8[0],ch,(void *)0x0,(void *)0x0,4);
  pObjIndex = get_obj_index(0);
  obj = create_object(pObjIndex,(int)ch->level);
  if (ch->pcdata == (PC_DATA *)0x0) {
    pCVar7 = &prof_none;
  }
  else {
    pCVar7 = &ch->pcdata->profs;
  }
  uVar2 = CProficiencies::ProfIndexLookup("firestarting");
  iVar4 = 0;
  if (uVar2 < 0x19) {
    iVar4 = pCVar7->profs[uVar2] + 1;
  }
  obj->value[0] = iVar4;
  obj->timer = (short)dur;
  obj_to_room(obj,ch->in_room);
  add_prof_affect(ch,"firestarting",dur,false);
  pPVar1 = ch->pcdata;
  sVar3 = CProficiencies::ProfIndexLookup("firestarting");
  if (pPVar1 == (PC_DATA *)0x0) {
    pCVar7 = &prof_none;
  }
  else {
    pCVar7 = &pPVar1->profs;
  }
  CProficiencies::CheckImprove(pCVar7,(int)sVar3,0xfa);
  if (local_2a8[0] != local_298) {
    operator_delete(local_2a8[0],local_298[0] + 1);
  }
  return;
}

Assistant:

void build_fire(CHAR_DATA *ch, int dur)
{
	if (number_percent() > 60 + ch->Profs()->GetProf("firestarting") * 3)
	{
		act("$n's fire dies out despite $s best attempts to kindle it.", ch, 0, 0, TO_ROOM);
		act("Your fire dies out despite your best attempts to kindle it.", ch, 0, 0, TO_CHAR);
		ch->Profs()->CheckImprove("firestarting", 300);
		return;
	}

	auto buffer = fmt::format("{}The spark is caught by some dried brush, and it quickly erupts into a blazing campfire!{}",
		get_char_color(ch, "lightred"),
		END_COLOR(ch));
	act(buffer.c_str(), ch, 0, 0, TO_ALL);

	auto fire = create_object(get_obj_index(OBJ_VNUM_CAMPFIRE), ch->level);
	fire->value[0] = ch->Profs()->GetProf("firestarting") + 1;
	fire->timer = dur;
	obj_to_room(fire, ch->in_room);
	add_prof_affect(ch, "firestarting", dur);
	ch->Profs()->CheckImprove("firestarting", 250);
}